

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<int>
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,int v,
          enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *p_nullparam)

{
  short *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (v < 0) {
    uVar10 = -v;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    lVar9 = -0x20;
    do {
      lVar8 = lVar9;
      *(short *)(&stack0xfffffffffffffff8 + lVar8) = (short)uVar10;
      if (uVar10 < 0x10000) break;
      uVar10 = uVar10 >> 0x10;
      lVar9 = lVar8 + 2;
    } while (lVar8 != -2);
    if (lVar8 != -2) {
      memset(&stack0xfffffffffffffffa + lVar8,0,-(lVar8 + 2));
    }
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_18;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_10;
    *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_28;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_20;
    uVar5 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 2);
    uVar6 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 4);
    uVar7 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 6);
    uVar10 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 8);
    uVar2 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 10);
    uVar3 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    uVar4 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xe);
    *(uint *)(this->values).super_array<unsigned_short,_16UL>.elems =
         *(uint *)(this->values).super_array<unsigned_short,_16UL>.elems ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 2) = uVar5 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uVar6 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 6) = uVar7 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = uVar10 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 10) = uVar2 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uVar3 ^ 0xffffffff;
    *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xe) = uVar4 ^ 0xffffffff;
    lVar9 = 0;
    do {
      psVar1 = (short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
      *psVar1 = *psVar1 + 1;
      if (*psVar1 != 0) {
        return;
      }
      bVar11 = lVar9 != 0x1e;
      lVar9 = lVar9 + 2;
    } while (bVar11);
    return;
  }
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  if (v == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      *(short *)((long)&local_28 + lVar8) = (short)v;
      lVar9 = lVar8 + 2;
      if ((uint)v < 0x10000) break;
      v = (uint)v >> 0x10;
    } while (lVar8 != 0x1e);
    if (lVar8 == 0x1e) goto LAB_0011cd31;
  }
  memset((void *)((long)&local_28 + lVar9),0,0x20 - lVar9);
LAB_0011cd31:
  *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_18;
  *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_10;
  *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_28;
  *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_20;
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }